

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authprogs_test_driver.c
# Opt level: O2

char * lowercase(char *string)

{
  char cVar1;
  size_t sVar2;
  char *__dest;
  __int32_t **pp_Var3;
  char *pcVar4;
  
  sVar2 = strlen(string);
  __dest = (char *)malloc(sVar2 + 1);
  if (__dest != (char *)0x0) {
    strcpy(__dest,string);
    for (pcVar4 = __dest; cVar1 = *pcVar4, (long)cVar1 != 0; pcVar4 = pcVar4 + 1) {
      pp_Var3 = __ctype_tolower_loc();
      *pcVar4 = (char)(*pp_Var3)[cVar1];
    }
  }
  return __dest;
}

Assistant:

static char* lowercase(const char* string)
{
  char *new_string;
  char *p;
  size_t stringSize;

  stringSize = CM_CAST(size_t, strlen(string) + 1);
  new_string = CM_CAST(char*, malloc(sizeof(char) * stringSize));

  if (new_string == CM_NULL) { /* NOLINT */
    return CM_NULL;            /* NOLINT */
  }
  strcpy(new_string, string);  /* NOLINT */
  for (p = new_string; *p != 0; ++p) {
    *p = CM_CAST(char, tolower(*p));
  }
  return new_string;
}